

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

uint32 trans_scanner_block_hash_fn(ScannerBlock *b,hash_fns_t *fns)

{
  uint32 uVar1;
  void *pvVar2;
  int iVar3;
  
  uVar1 = 0;
  if (0 < (long)fns->data[0]) {
    uVar1 = 0;
    pvVar2 = (void *)0x0;
    do {
      iVar3 = 0;
      if (b->transitions[(long)pvVar2] != (ScanStateTransition *)0x0) {
        iVar3 = b->transitions[(long)pvVar2]->index + 1;
      }
      uVar1 = uVar1 * 3 + iVar3;
      pvVar2 = (void *)((long)pvVar2 + 1);
    } while (fns->data[0] != pvVar2);
  }
  return uVar1;
}

Assistant:

static uint32 trans_scanner_block_hash_fn(ScannerBlock *b, hash_fns_t *fns) {
  uint32 hash = 0;
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanStateTransition **sb = b->transitions;

  for (i = 0; i < block_size; i++) {
    hash *= 3;
    hash += sb[i] ? sb[i]->index + 1 : 0;
  }
  return hash;
}